

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O3

void ViewTrack_MFM_FM(Encoding encoding,BitBuffer *bitbuf)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined7 extraout_var;
  undefined8 uVar5;
  undefined4 extraout_var_02;
  undefined7 uVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  LogHelper *pLVar6;
  byte bVar8;
  int i;
  char cVar9;
  uint uVar10;
  uint uVar11;
  size_type __n;
  uint uVar12;
  vector<colour,_std::allocator<colour>_> colours;
  Data track_data;
  colour local_9d;
  int local_9c;
  vector<colour,_std::allocator<colour>_> local_98;
  Encoding local_74;
  uint local_70;
  Encoding local_6c;
  undefined8 local_68;
  undefined8 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uint local_38;
  Encoding local_34;
  
  local_34 = encoding;
  iVar3 = BitBuffer::track_bitsize(bitbuf);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (colour *)0x0;
  local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_start = (colour *)0x0;
  local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_finish = (colour *)0x0;
  __n = (size_type)((iVar3 * 0x6e) / 100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_58,__n);
  std::vector<colour,_std::allocator<colour>_>::reserve(&local_98,__n);
  iVar3 = opt.a1sync;
  local_60 = 0;
  BitBuffer::seek(bitbuf,0);
  local_38 = (uint)(iVar3 == 0) << 5 | 0xffdf;
  local_68 = 0;
  iVar3 = 0;
  uVar11 = 0;
  local_74 = encoding;
  uVar12 = 0xffff;
LAB_001518a2:
  uVar10 = 0;
  local_6c = encoding;
  do {
    uVar10 = ~uVar10;
LAB_001518ad:
    uVar4 = uVar10;
    bVar1 = BitBuffer::wrapped(bitbuf);
    if (bVar1) {
      iVar3 = 0;
      if (0 < opt.bytes_begin) {
        iVar3 = opt.bytes_begin;
      }
      uVar11 = (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
               (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar11;
      if (opt.bytes_end < (int)uVar11) {
        uVar12 = opt.bytes_end;
      }
      if (opt.bytes_end < 0) {
        uVar12 = uVar11;
      }
      if (iVar3 < (int)uVar12) {
        pLVar6 = util::operator<<((LogHelper *)&util::cout,&local_34);
        pLVar6 = util::operator<<(pLVar6,(char (*) [10])" Decode (");
        local_70 = BitBuffer::track_bitsize(bitbuf);
        pLVar6 = util::operator<<(pLVar6,(int *)&local_70);
        util::operator<<(pLVar6,(char (*) [9])" bits):\n");
        util::
        hex_dump<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar12),iVar3,
                   local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                   super__Vector_impl_data._M_start,0x10);
      }
      if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
          super__Vector_impl_data._M_start != (colour *)0x0) {
        operator_delete(local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    bVar2 = BitBuffer::read1(bitbuf);
    uVar11 = (uint)bVar2 | uVar11 * 2;
    if (encoding != MFM) {
      if (encoding != FM) goto LAB_00151924;
      if ((int)uVar11 < -0x55ddd576) {
        if ((0x22 < uVar11 + 0x55ddd778) ||
           ((0x500000005U >> ((ulong)(uVar11 + 0x55ddd778) & 0x3f) & 1) == 0)) goto LAB_00151924;
      }
      else if (((uVar11 != 0xaa222a8a) && (uVar11 != 0xaa222aa8)) && (uVar11 != 0xaa2a2a88))
      goto LAB_00151924;
      bVar1 = false;
      goto LAB_00151973;
    }
    if ((uVar11 & local_38) == 0x4489) {
      bVar1 = false;
      goto LAB_00151acc;
    }
    uVar10 = -uVar4;
    encoding = MFM;
  } while (uVar4 != 0xfffffff0);
  bVar1 = true;
LAB_00151acc:
  bVar8 = 7;
  uVar10 = 0xe;
  bVar2 = 0;
  do {
    bVar2 = bVar2 | ((uVar11 >> (uVar10 & 0x1f) & 1) != 0) << (bVar8 & 0x1f);
    bVar8 = bVar8 - 1;
    uVar10 = uVar10 - 2;
  } while (uVar10 != 0xfffffffe);
  goto LAB_00151998;
LAB_00151924:
  uVar10 = uVar4 - 1;
  if (uVar4 - 1 != 0xffffffdf) goto LAB_001518ad;
  bVar1 = true;
  if (encoding == MFM) goto LAB_00151acc;
LAB_00151973:
  bVar8 = 7;
  uVar10 = 0x1d;
  bVar2 = 0;
  do {
    bVar2 = bVar2 | ((uVar11 >> (uVar10 & 0x1f) & 1) != 0) << (bVar8 & 0x1f);
    bVar8 = bVar8 - 1;
    uVar10 = uVar10 - 4;
  } while (uVar10 != 0xfffffffd);
LAB_00151998:
  uVar7 = 0;
  local_70 = CONCAT31(local_70._1_3_,bVar2);
  local_9c = iVar3;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
               (iterator)
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_70);
    uVar7 = extraout_var;
  }
  else {
    *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = bVar2;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  uVar10 = uVar12 + 1;
  if (local_6c == MFM && !bVar1) {
    local_9d = (uVar4 != 0xfffffff0) * -0x80 + YELLOW;
    if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                (&local_98,
                 (iterator)
                 local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_9d);
    }
    else {
      *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_9d;
      local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar3 = local_9c + 1;
    encoding = MFM;
    uVar12 = uVar10;
    goto LAB_001518a2;
  }
  uVar5 = CONCAT71(uVar7,(char)local_68 == -2);
  if (uVar10 == 4 && (char)local_68 == -2) {
    iVar3 = Sector::SizeCodeToLength(local_70 & 0xff);
    uVar5 = CONCAT44(extraout_var_02,iVar3);
    local_60 = uVar5;
  }
  if (local_9c == 3) {
    local_9d = RED;
    if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                (&local_98,
                 (iterator)
                 local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_9d);
      uVar5 = extraout_RAX;
      encoding = local_6c;
    }
    else {
      *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
       _M_finish = RED;
      local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
      encoding = local_6c;
    }
  }
  else {
    uVar7 = (undefined7)((ulong)uVar5 >> 8);
    if (bVar1 || local_74 != FM) {
      cVar9 = (char)local_68;
      if (uVar12 < 4 && cVar9 == -2) {
        local_9d = (uVar10 != 3) * -0x80 + GREEN;
        if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_9d);
          uVar7 = extraout_var_00;
        }
        else {
          *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = local_9d;
          local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_68 = CONCAT71(uVar7,0xfe);
      }
      else if (((cVar9 == -5) && (-1 < (int)uVar12)) && ((int)uVar12 < (int)local_60)) {
        local_9d = none;
        if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_9d);
          uVar7 = extraout_var_01;
        }
        else {
          *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = none;
          local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_68 = CONCAT71(uVar7,0xfb);
      }
      else {
        if ((cVar9 == -2 && (uVar12 & 0xfffffffe) == 4) ||
           (((cVar9 == -5 && ((int)local_60 <= (int)uVar12)) && ((int)uVar12 < (int)local_60 + 2))))
        {
          local_9d = MAGENTA;
          if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_9d);
            goto LAB_00151c28;
          }
          *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = MAGENTA;
        }
        else {
          local_9d = cyan;
          if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_9d);
            goto LAB_00151c28;
          }
          *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = cyan;
        }
        local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
LAB_00151c28:
      iVar3 = 0;
      encoding = local_74;
      uVar12 = uVar10;
      goto LAB_001518a2;
    }
    local_9d = (uVar4 != 0xffffffe0) * -0x80 + RED;
    uVar5 = CONCAT71(uVar7,local_9d);
    if (local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                (&local_98,
                 (iterator)
                 local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_9d);
      uVar5 = extraout_RAX_00;
    }
    else {
      *local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_9d;
      local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    encoding = FM;
  }
  local_68 = CONCAT71((int7)((ulong)uVar5 >> 8),(undefined1)local_70);
  iVar3 = 0;
  uVar12 = 0;
  goto LAB_001518a2;
}

Assistant:

void ViewTrack_MFM_FM(Encoding encoding, BitBuffer& bitbuf)
{
    auto max_size = bitbuf.track_bitsize() * 110 / 100;

    Data track_data;
    std::vector<colour> colours;
    track_data.reserve(max_size);
    colours.reserve(max_size);

    uint32_t dword = 0;
    int bits = 0, a1 = 0, am_dist = 0xffff, data_size = 0;
    uint8_t am = 0;
    uint16_t sync_mask = opt.a1sync ? 0xffdf : 0xffff;

    bitbuf.seek(0);
    while (!bitbuf.wrapped())
    {
        dword = (dword << 1) | bitbuf.read1();
        ++bits;

        bool found_am = false;
        if (encoding == Encoding::MFM && (dword & sync_mask) == 0x4489)
        {
            found_am = true;
        }
        else if (encoding == Encoding::FM)
        {
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                found_am = true;
                break;
            }
        }

        if (found_am || (bits == (encoding == Encoding::MFM ? 16 : 32)))
        {
            // Decode data byte.
            uint8_t b = 0;
            if (encoding == Encoding::MFM)
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 2)) & 1) << i);
            }
            else
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 4 + 1)) & 1) << i);
            }
            track_data.push_back(b);
            ++am_dist;

            if (encoding == Encoding::MFM && found_am)
            {
                // A1 sync byte (red if aligned to bitstream, magenta if not).
                colours.push_back((bits == 16) ? colour::YELLOW : colour::yellow);
                ++a1;
            }
            else
            {
                if (am == 0xfe && am_dist == 4)
                    data_size = Sector::SizeCodeToLength(b);

                if (a1 == 3)
                {
                    colours.push_back(colour::RED);
                    am = b;
                    am_dist = 0;
                }
                else if (encoding == Encoding::FM && found_am)
                {
                    colours.push_back((bits == 32) ? colour::RED : colour::red);
                    am = b;
                    am_dist = 0;
                }
                else if (am == 0xfe && am_dist >= 1 && am_dist <= 4)
                {
                    colours.push_back((am_dist == 3) ? colour::GREEN : colour::green);
                }
                else if (am == 0xfb && am_dist >= 1 && am_dist <= data_size)
                {
                    colours.push_back(colour::white);
                }
                else if ((am == 0xfe && am_dist > 4 && am_dist <= 6) ||
                    (am == 0xfb && am_dist > data_size&& am_dist <= (data_size + 2)))
                {
                    colours.push_back(colour::MAGENTA);
                }
                else
                {
                    colours.push_back(colour::grey);
                }

                a1 = 0;
            }

            bits = 0;
        }
    }

    auto show_begin = std::max(opt.bytes_begin, 0);
    auto show_end = (opt.bytes_end < 0) ? track_data.size() :
        std::min(opt.bytes_end, track_data.size());
    if (show_end > show_begin)
    {
        util::cout << encoding << " Decode (" << bitbuf.track_bitsize() << " bits):\n";
        util::hex_dump(track_data.begin(), track_data.begin() + show_end,
            show_begin, colours.data());
    }
}